

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subflow.cc
# Opt level: O3

bool __thiscall SubfloatFlow::traceForward(SubfloatFlow *this,ReplaceVarnode *rvn)

{
  pointer *pppRVar1;
  size_t *psVar2;
  OpCode opc;
  _List_node_base *p_Var3;
  PcodeOp *op;
  Varnode *vn;
  pointer ppVVar4;
  iterator __position;
  ReplaceVarnode *pRVar5;
  bool bVar6;
  ReplaceOp *rop;
  _List_node_base *p_Var7;
  uint numparam;
  ulong uVar8;
  _Self __tmp;
  int slot;
  ulong uVar9;
  bool inworklist;
  ReplaceVarnode *rvn2;
  bool local_59;
  ReplaceVarnode *local_58;
  _List_node_base *local_50;
  ReplaceVarnode *local_48;
  vector<SubfloatFlow::ReplaceVarnode*,std::allocator<SubfloatFlow::ReplaceVarnode*>> *local_40;
  list<SubfloatFlow::CompareRecord,_std::allocator<SubfloatFlow::CompareRecord>_> *local_38;
  
  local_50 = (_List_node_base *)&rvn->vn->descend;
  local_40 = (vector<SubfloatFlow::ReplaceVarnode*,std::allocator<SubfloatFlow::ReplaceVarnode*>> *)
             &this->worklist;
  local_38 = &this->complist;
  p_Var3 = (rvn->vn->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  local_58 = rvn;
LAB_002cc418:
  while (p_Var7 = p_Var3, p_Var7 != local_50) {
    p_Var3 = p_Var7->_M_next;
    op = (PcodeOp *)p_Var7[1]._M_next;
    vn = op->output;
    if ((vn == (Varnode *)0x0) || ((vn->flags & 1) == 0)) {
      ppVVar4 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar8 = (ulong)((long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar4) >> 3;
      numparam = (uint)uVar8;
      if ((int)numparam < 1) {
        uVar9 = 0;
      }
      else {
        uVar9 = 0;
        do {
          if (ppVVar4[uVar9] == local_58->vn) goto LAB_002cc479;
          uVar9 = uVar9 + 1;
        } while ((numparam & 0x7fffffff) != uVar9);
        uVar9 = uVar8 & 0xffffffff;
      }
LAB_002cc479:
      opc = op->opcode->opcode;
      slot = (int)uVar9;
      switch(opc) {
      case CPUI_FLOAT_EQUAL:
      case CPUI_FLOAT_NOTEQUAL:
      case CPUI_FLOAT_LESS:
      case CPUI_FLOAT_LESSEQUAL:
        local_48 = setReplacement(this,ppVVar4[1 - slot],&local_59);
        if (local_48 == (ReplaceVarnode *)0x0) goto switchD_002cc49a_caseD_2d;
        if (local_59 == true) {
          __position._M_current =
               (this->worklist).
               super__Vector_base<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->worklist).
              super__Vector_base<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<SubfloatFlow::ReplaceVarnode*,std::allocator<SubfloatFlow::ReplaceVarnode*>>
            ::_M_realloc_insert<SubfloatFlow::ReplaceVarnode*const&>(local_40,__position,&local_48);
          }
          else {
            *__position._M_current = local_48;
            pppRVar1 = &(this->worklist).
                        super__Vector_base<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppRVar1 = *pppRVar1 + 1;
          }
        }
        pRVar5 = local_48;
        p_Var7 = (_List_node_base *)operator_new(0x28);
        p_Var7[1]._M_next = (_List_node_base *)0x0;
        p_Var7[1]._M_prev = (_List_node_base *)0x0;
        p_Var7[2]._M_next = (_List_node_base *)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var7);
        psVar2 = &(this->complist).
                  super__List_base<SubfloatFlow::CompareRecord,_std::allocator<SubfloatFlow::CompareRecord>_>
                  ._M_impl._M_node._M_size;
        *psVar2 = *psVar2 + 1;
        p_Var7 = (this->complist).
                 super__List_base<SubfloatFlow::CompareRecord,_std::allocator<SubfloatFlow::CompareRecord>_>
                 ._M_impl._M_node.super__List_node_base._M_prev;
        if (slot == 0) {
          p_Var7[1]._M_next = (_List_node_base *)local_58;
          p_Var7[1]._M_prev = (_List_node_base *)pRVar5;
          p_Var7[2]._M_next = (_List_node_base *)op;
        }
        else {
          p_Var7[1]._M_next = (_List_node_base *)pRVar5;
          p_Var7[1]._M_prev = (_List_node_base *)local_58;
          p_Var7[2]._M_next = (_List_node_base *)op;
        }
        break;
      case CPUI_FLOAT_LESSEQUAL|CPUI_COPY:
      case CPUI_FLOAT_INT2FLOAT:
        goto switchD_002cc49a_caseD_2d;
      case CPUI_FLOAT_ADD:
      case CPUI_FLOAT_DIV:
      case CPUI_FLOAT_MULT:
      case CPUI_FLOAT_SUB:
      case CPUI_FLOAT_NEG:
      case CPUI_FLOAT_ABS:
      case CPUI_FLOAT_SQRT:
      case CPUI_FLOAT_CEIL:
      case CPUI_FLOAT_FLOOR:
      case CPUI_FLOAT_ROUND:
      case CPUI_MULTIEQUAL:
        goto switchD_002cc49a_caseD_2f;
      case CPUI_FLOAT_FLOAT2FLOAT:
        if (vn->size < this->precision) goto switchD_002cc49a_caseD_2d;
      case CPUI_FLOAT_NAN:
      case CPUI_FLOAT_TRUNC:
        addtopulllist(this,op,local_58);
        break;
      default:
        if (opc == CPUI_COPY) goto switchD_002cc49a_caseD_2f;
        goto switchD_002cc49a_caseD_2d;
      }
    }
  }
  goto switchD_002cc49a_caseD_2d;
switchD_002cc49a_caseD_2f:
  rop = createOpDown(this,opc,numparam,op,local_58,slot);
  bVar6 = createLink(this,rop,-1,vn);
  if (!bVar6) {
switchD_002cc49a_caseD_2d:
    return p_Var7 == local_50;
  }
  goto LAB_002cc418;
}

Assistant:

bool SubfloatFlow::traceForward(ReplaceVarnode *rvn)

{ // Try to trace logical variable through descendant varnodes
  // updating list/map of replace_ops and replace_varnodes
  // and the worklist
  ReplaceVarnode *rvn2;
  ReplaceOp *rop;
  PcodeOp *op;
  Varnode *outvn;
  int4 slot;
  bool inworklist;
  int4 dcount = 0;
  int4 hcount = 0;

  list<PcodeOp *>::const_iterator iter,enditer;
  iter = rvn->vn->beginDescend();
  enditer = rvn->vn->endDescend();
  while(iter != enditer) {
    op = *iter++;
    outvn = op->getOut();
    if ((outvn!=(Varnode *)0)&&(outvn->isMark()))
      continue;
    dcount += 1;		// Count this descendant
    slot = op->getSlot(rvn->vn);
    switch(op->code()) {
    case CPUI_COPY:
    case CPUI_FLOAT_CEIL:
    case CPUI_FLOAT_FLOOR:
    case CPUI_FLOAT_ROUND:
    case CPUI_FLOAT_NEG:
    case CPUI_FLOAT_ABS:
    case CPUI_FLOAT_SQRT:
    case CPUI_FLOAT_ADD:
    case CPUI_FLOAT_SUB:
    case CPUI_FLOAT_MULT:
    case CPUI_FLOAT_DIV:
    case CPUI_MULTIEQUAL:
      rop = createOpDown(op->code(),op->numInput(),op,rvn,slot);
      if (!createLink(rop,-1,outvn)) return false;
      hcount += 1;		// Dealt with this descendant
      break;
    case CPUI_FLOAT_FLOAT2FLOAT:
      if (outvn->getSize() < precision)
	return false;
      addtopulllist(op,rvn);
      hcount += 1;		// Dealt with this descendant
      break;
    case CPUI_FLOAT_EQUAL:
    case CPUI_FLOAT_NOTEQUAL:
    case CPUI_FLOAT_LESS:
    case CPUI_FLOAT_LESSEQUAL:
      rvn2 = setReplacement(op->getIn(1-slot),inworklist);
      if (rvn2 == (ReplaceVarnode *)0) return false;
      if (inworklist)
	worklist.push_back(rvn2);
      if (slot == 0)
	addtocomplist(rvn,rvn2,op);
      else
	addtocomplist(rvn2,rvn,op);
      hcount += 1;		// Dealt with this descendant
      break;
    case CPUI_FLOAT_TRUNC:
    case CPUI_FLOAT_NAN:
      addtopulllist(op,rvn);
      hcount += 1;
      break;
    default:
      return false;
    }
  }
  if (dcount != hcount) {
    // Must account for all descendants of an input
    if (rvn->vn->isInput()) return false;
  }
  return true;
}